

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.h
# Opt level: O2

pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* mp::ReadSOLFile<mp::NLW2_SOLHandler_C_Impl>
            (pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *name,NLW2_SOLHandler_C_Impl *solh,NLUtils *utl,
            int *p_internal_rv)

{
  NLW2_SOLReadResultCode NVar1;
  SOLReader2<mp::NLW2_SOLHandler_C_Impl> solr;
  undefined1 local_4a0 [352];
  int local_340;
  
  SOLReader2<mp::NLW2_SOLHandler_C_Impl>::SOLReader2
            ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)local_4a0,solh,utl);
  NVar1 = SOLReader2<mp::NLW2_SOLHandler_C_Impl>::ReadSOLFile
                    ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)local_4a0,name);
  if (p_internal_rv != (int *)0x0) {
    *p_internal_rv = local_340;
  }
  __return_storage_ptr__->first = NVar1;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->second,(string *)(local_4a0 + 0x140));
  SOLReader2<mp::NLW2_SOLHandler_C_Impl>::~SOLReader2
            ((SOLReader2<mp::NLW2_SOLHandler_C_Impl> *)local_4a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<NLW2_SOLReadResultCode, std::string>
ReadSOLFile(
    const std::string& name,
		SOLHandler& solh, NLUtils& utl, int* p_internal_rv=nullptr) {
  SOLReader2<SOLHandler> solr(solh, utl);
	auto res = solr.ReadSOLFile(name);
	if (p_internal_rv)
		*p_internal_rv = solr.internal_rv();
	return { res, solr.ErrorMessage(res) };
}